

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall
BuildWithDepsLogTestValidationThroughDepfile::~BuildWithDepsLogTestValidationThroughDepfile
          (BuildWithDepsLogTestValidationThroughDepfile *this)

{
  BuildWithDepsLogTest::~BuildWithDepsLogTest(&this->super_BuildWithDepsLogTest);
  operator_delete(this,0x4a8);
  return;
}

Assistant:

TEST_F(BuildWithDepsLogTest, ValidationThroughDepfile) {
  const char* manifest =
      "build out: cat in |@ validate\n"
      "build validate: cat in2 | out\n"
      "build out2: cat in3\n"
      "  deps = gcc\n"
      "  depfile = out2.d\n";

  string err;

  {
    fs_.Create("in", "");
    fs_.Create("in2", "");
    fs_.Create("in3", "");
    fs_.Create("out2.d", "out: out");

    State state;
    ASSERT_NO_FATAL_FAILURE(AddCatRule(&state));
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    DepsLog deps_log;
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));
    ASSERT_EQ("", err);

    Builder builder(&state, config_, NULL, &deps_log, &fs_, &status_, 0);
    builder.command_runner_.reset(&command_runner_);

    EXPECT_TRUE(builder.AddTarget("out2", &err));
    ASSERT_EQ("", err);

    EXPECT_TRUE(builder.Build(&err));
    EXPECT_EQ("", err);

    // On the first build, only the out2 command is run.
    ASSERT_EQ(command_runner_.commands_ran_.size(), 1);
    EXPECT_EQ("cat in3 > out2", command_runner_.commands_ran_[0]);

    // The deps file should have been removed.
    EXPECT_EQ(0, fs_.Stat("out2.d", &err));

    deps_log.Close();
    builder.command_runner_.release();
  }

  fs_.Tick();
  command_runner_.commands_ran_.clear();

  {
    fs_.Create("in2", "");
    fs_.Create("in3", "");

    State state;
    ASSERT_NO_FATAL_FAILURE(AddCatRule(&state));
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    DepsLog deps_log;
    ASSERT_TRUE(deps_log.Load("ninja_deps", &state, &err));
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));
    ASSERT_EQ("", err);

    Builder builder(&state, config_, NULL, &deps_log, &fs_, &status_, 0);
    builder.command_runner_.reset(&command_runner_);

    EXPECT_TRUE(builder.AddTarget("out2", &err));
    ASSERT_EQ("", err);

    EXPECT_TRUE(builder.Build(&err));
    EXPECT_EQ("", err);

    // The out and validate actions should have been run as well as out2.
    ASSERT_EQ(command_runner_.commands_ran_.size(), 3);
    // out has to run first, as both out2 and validate depend on it.
    EXPECT_EQ("cat in > out", command_runner_.commands_ran_[0]);

    deps_log.Close();
    builder.command_runner_.release();
  }
}